

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O1

char * __thiscall kj::StringTree::flattenTo(StringTree *this,char *target)

{
  size_t sVar1;
  Branch *pBVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  StringTree *this_00;
  ulong uVar7;
  char *local_40;
  anon_class_8_1_6ca262cf local_38;
  
  local_38.target = &local_40;
  sVar1 = (this->branches).size_;
  local_40 = target;
  if (sVar1 == 0) {
    uVar6 = 0;
  }
  else {
    pBVar2 = (this->branches).ptr;
    lVar3 = sVar1 << 6;
    uVar6 = 0;
    do {
      this_00 = &pBVar2->content;
      sVar5 = *(ulong *)((long)(this_00 + -1) + 0x30) - uVar6;
      if (uVar6 <= *(ulong *)((long)(this_00 + -1) + 0x30) && sVar5 != 0) {
        pcVar4 = "";
        if ((this->text).content.size_ != 0) {
          pcVar4 = (this->text).content.ptr;
        }
        memcpy(local_40,pcVar4 + uVar6,sVar5);
        local_40 = local_40 + sVar5;
        uVar6 = *(ulong *)((long)(this_00 + -1) + 0x30);
      }
      visit<kj::StringTree::flattenTo(char*)const::__0&>(this_00,&local_38);
      pBVar2 = (Branch *)(this_00 + 1);
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != 0);
  }
  sVar1 = (this->text).content.size_;
  uVar7 = 0;
  if (sVar1 != 0) {
    uVar7 = sVar1 - 1;
  }
  sVar5 = uVar7 - uVar6;
  if (uVar6 <= uVar7 && sVar5 != 0) {
    if (sVar1 == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (this->text).content.ptr;
    }
    memcpy(local_40,pcVar4 + uVar6,sVar5);
    local_40 = local_40 + sVar5;
  }
  return local_40;
}

Assistant:

char* StringTree::flattenTo(char* __restrict__ target) const {
  visit([&target](ArrayPtr<const char> text) {
    memcpy(target, text.begin(), text.size());
    target += text.size();
  });
  return target;
}